

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

char * stringify_argv(int argc,char **argv)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  size_t __size;
  
  if (argc < 1) {
    pcVar3 = (char *)malloc(1);
    pcVar4 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    __size = 1;
    uVar8 = 0;
    do {
      sVar2 = strlen(argv[uVar8]);
      __size = __size + sVar2 + 1;
      uVar8 = uVar8 + 1;
    } while ((uint)argc != uVar8);
    pcVar3 = (char *)malloc(__size);
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    pcVar4 = pcVar3;
    if (0 < argc) {
      uVar8 = 0;
      do {
        pcVar6 = pcVar4;
        lVar5 = 1;
        while( true ) {
          cVar1 = argv[uVar8][lVar5 + -1];
          cVar7 = ' ';
          if ((cVar1 != '\t') && (cVar7 = cVar1, cVar1 == '\0')) break;
          pcVar6[lVar5 + -1] = cVar7;
          lVar5 = lVar5 + 1;
        }
        pcVar6[lVar5 + -1] = ' ';
        uVar8 = uVar8 + 1;
        pcVar4 = pcVar6 + lVar5;
      } while (uVar8 != (uint)argc);
      pcVar4 = pcVar6 + lVar5;
    }
  }
  *pcVar4 = '\0';
  return pcVar3;
}

Assistant:

char *stringify_argv(int argc, char *argv[]) {
    char *str, *cp;
    size_t nbytes = 1;
    int i, j;

    /* Allocate */
    for (i = 0; i < argc; i++) {
	nbytes += strlen(argv[i]) + 1;
    }
    if (!(str = malloc(nbytes)))
	return NULL;

    /* Copy */
    cp = str;
    for (i = 0; i < argc; i++) {
	j = 0;
	while (argv[i][j]) {
	    if (argv[i][j] == '\t')
		*cp++ = ' ';
	    else
		*cp++ = argv[i][j];
	    j++;
	}
	*cp++ = ' ';
    }
    *cp++ = 0;

    return str;
}